

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall cmFindPackageCommand::FillPrefixesUserRegistry(cmFindPackageCommand *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string debugBuffer;
  string dir;
  string local_a0;
  string local_80;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_28;
  
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  bVar1 = cmsys::SystemTools::GetEnv("HOME",&local_80);
  if (bVar1) {
    std::__cxx11::string::append((char *)&local_80);
    std::__cxx11::string::_M_append((char *)&local_80,(ulong)(this->Name)._M_dataplus._M_p);
    pmVar2 = std::
             map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
             ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                          &PathLabel::UserRegistry.super_PathLabel);
    LoadPackageRegistryDir(this,&local_80,pmVar2);
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "CMake User Package Registry [CMAKE_FIND_USE_PACKAGE_REGISTRY].\n","");
    pmVar2 = std::
             map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
             ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                          &PathLabel::UserRegistry.super_PathLabel);
    anon_unknown.dwarf_d8cdcd::collectPathsForDebug(&local_a0,pmVar2,0);
    local_40._M_str = (this->DebugBuffer)._M_dataplus._M_p;
    local_40._M_len = (this->DebugBuffer)._M_string_length;
    local_30 = local_a0._M_string_length;
    local_28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a0._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = &local_40;
    cmCatViews_abi_cxx11_(&local_60,views);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesUserRegistry()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LoadPackageRegistryWinUser();
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) ==
      B_OK) {
    std::string fname = cmStrCat(dir, "/cmake/packages/", Name);
    this->LoadPackageRegistryDir(fname,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
  }
#else
  std::string dir;
  if (cmSystemTools::GetEnv("HOME", dir)) {
    dir += "/.cmake/packages/";
    dir += this->Name;
    this->LoadPackageRegistryDir(dir,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
  }
#endif
  if (this->DebugMode) {
    std::string debugBuffer =
      "CMake User Package Registry [CMAKE_FIND_USE_PACKAGE_REGISTRY].\n";
    collectPathsForDebug(debugBuffer,
                         this->LabeledPaths[PathLabel::UserRegistry]);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}